

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O1

void __thiscall re2c::DFA::reorder(DFA *this)

{
  State **__args;
  pointer ppSVar1;
  uint uVar2;
  DFA *pDVar3;
  long lVar4;
  ulong uVar5;
  pair<std::_Rb_tree_iterator<re2c::State_*>,_bool> pVar6;
  State *s;
  vector<re2c::State_*,_std::allocator<re2c::State_*>_> ord;
  State *q;
  queue<re2c::State_*,_std::deque<re2c::State_*,_std::allocator<re2c::State_*>_>_> todo;
  set<re2c::State_*,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_> done;
  State *local_e0;
  vector<re2c::State_*,_std::allocator<re2c::State_*>_> local_d8;
  State *local_c0;
  _Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_> local_b8;
  DFA *local_68;
  _Rb_tree<re2c::State_*,_re2c::State_*,_std::_Identity<re2c::State_*>,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>
  local_60;
  
  local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  std::vector<re2c::State_*,_std::allocator<re2c::State_*>_>::reserve
            (&local_d8,(ulong)this->nStates);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>::_M_initialize_map(&local_b8,0);
  __args = &this->head;
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<re2c::State*,std::allocator<re2c::State*>>::_M_push_back_aux<re2c::State*const&>
              ((deque<re2c::State*,std::allocator<re2c::State*>> *)&local_b8,__args);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
  ::_M_insert_unique<re2c::State*const&>
            ((_Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
              *)&local_60,__args);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_e0 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<re2c::State*,std::allocator<re2c::State*>>::
        _M_realloc_insert<re2c::State*const&>
                  ((vector<re2c::State*,std::allocator<re2c::State*>> *)&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_e0);
      }
      else {
        *local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_e0;
        local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if ((local_e0->go).nSpans != 0) {
        lVar4 = 8;
        uVar5 = 0;
        do {
          local_c0 = *(State **)((long)&((local_e0->go).span)->ub + lVar4);
          if (local_c0 != (State *)0x0) {
            pVar6 = std::
                    _Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
                    ::_M_insert_unique<re2c::State*const&>
                              ((_Rb_tree<re2c::State*,re2c::State*,std::_Identity<re2c::State*>,std::less<re2c::State*>,std::allocator<re2c::State*>>
                                *)&local_60,&local_c0);
            if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<re2c::State*,std::allocator<re2c::State*>>::
                _M_push_back_aux<re2c::State*const&>
                          ((deque<re2c::State*,std::allocator<re2c::State*>> *)&local_b8,&local_c0);
              }
              else {
                *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c0;
                local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < (local_e0->go).nSpans);
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pDVar3 = local_68;
  if ((long)local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (ulong)local_68->nStates) {
    local_e0 = (State *)0x0;
    std::vector<re2c::State*,std::allocator<re2c::State*>>::emplace_back<re2c::State*>
              ((vector<re2c::State*,std::allocator<re2c::State*>> *)&local_d8,&local_e0);
    uVar2 = pDVar3->nStates;
    if ((ulong)uVar2 != 0) {
      uVar5 = 0;
      do {
        ppSVar1 = local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar5;
        lVar4 = uVar5 + 1;
        uVar5 = uVar5 + 1;
        (*ppSVar1)->next =
             local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar4];
      } while (uVar2 != uVar5);
    }
    std::
    _Rb_tree<re2c::State_*,_re2c::State_*,_std::_Identity<re2c::State_*>,_std::less<re2c::State_*>,_std::allocator<re2c::State_*>_>
    ::~_Rb_tree(&local_60);
    std::_Deque_base<re2c::State_*,_std::allocator<re2c::State_*>_>::~_Deque_base(&local_b8);
    if (local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<re2c::State_*,_std::allocator<re2c::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("nStates == ord.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/re2c/src/ir/adfa/adfa.cc"
                ,0x76,"void re2c::DFA::reorder()");
}

Assistant:

void DFA::reorder()
{
	std::vector<State*> ord;
	ord.reserve(nStates);

	std::queue<State*> todo;
	todo.push(head);

	std::set<State*> done;
	done.insert(head);

	for(;!todo.empty();)
	{
		State *s = todo.front();
		todo.pop();
		ord.push_back(s);
		for(uint32_t i = 0; i < s->go.nSpans; ++i)
		{
			State *q = s->go.span[i].to;
			if(q && done.insert(q).second)
			{
				todo.push(q);
			}
		}
	}

	assert(nStates == ord.size());

	ord.push_back(NULL);
	for(uint32_t i = 0; i < nStates; ++i)
	{
		ord[i]->next = ord[i + 1];
	}
}